

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void tcache_init(tsd_t *tsd,tcache_slow_t *tcache_slow,tcache_t *tcache,void *mem,
                cache_bin_info_t *duckdb_je_tcache_bin_info)

{
  uint ninfos;
  ulong uVar1;
  ulong uVar2;
  cache_bin_t *pcVar3;
  cache_bin_info_t *info;
  ulong uVar4;
  size_t cur_offset;
  size_t local_40;
  tcache_slow_t *local_38;
  
  (tcache_slow->link).qre_next = (tcache_slow_t *)tsd;
  *(tcache_slow_t **)
   ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard + 0xf) =
       tcache_slow;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled = false;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level = '\0';
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_min_init_state_nfetched = '\0';
  *(undefined5 *)&tsd->field_0x3 = 0;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event = 0;
  *(undefined4 *)
   ((long)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_dalloc_event_wait +
   4) = 0;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_event_wait = 0;
  *(tcache_t **)
   ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard + 7) = tcache;
  ninfos = (uint)tsd->
                 cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_dalloc_event_wait;
  uVar4 = (ulong)ninfos;
  local_40 = 0;
  duckdb_je_cache_bin_preincrement((cache_bin_info_t *)mem,ninfos,tcache,&local_40);
  if (uVar4 != 0) {
    pcVar3 = (cache_bin_t *)&(tcache_slow->link).qre_prev;
    uVar2 = 0;
    info = (cache_bin_info_t *)mem;
    local_38 = tcache_slow;
    do {
      if (uVar2 < 0x24) {
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard
        [uVar2 - 0x69] = '\x01';
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard
        [uVar2 - 0x45] = '\0';
        uVar1 = duckdb_je_opt_tcache_gc_delay_bytes / duckdb_je_sz_index2size_tab[uVar2];
        if (0xfe < uVar1) {
          uVar1 = 0xff;
        }
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard
        [uVar2 - 0x21] = (uint8_t)uVar1;
      }
      if (info->ncached_max == 0) {
        cache_bin_init_disabled(pcVar3,0);
      }
      else {
        duckdb_je_cache_bin_init(pcVar3,info,tcache,&local_40);
      }
      uVar2 = uVar2 + 1;
      pcVar3 = pcVar3 + 1;
      info = info + 1;
    } while (uVar4 != uVar2);
    tcache_slow = local_38;
    if (0x48 < ninfos) goto LAB_01d800ce;
  }
  pcVar3 = (cache_bin_t *)(tcache_slow->lg_fill_div + uVar4 * 0x18 + -0x30);
  do {
    uVar4 = uVar4 + 1;
    cache_bin_init_disabled(pcVar3,*(cache_bin_sz_t *)((long)mem + uVar4 * 2 + -2));
    pcVar3 = pcVar3 + 1;
  } while ((int)uVar4 != 0x49);
LAB_01d800ce:
  duckdb_je_cache_bin_postincrement(tcache,&local_40);
  return;
}

Assistant:

static void
tcache_init(tsd_t *tsd, tcache_slow_t *tcache_slow, tcache_t *tcache,
    void *mem, const cache_bin_info_t *tcache_bin_info) {
	tcache->tcache_slow = tcache_slow;
	tcache_slow->tcache = tcache;

	memset(&tcache_slow->link, 0, sizeof(ql_elm(tcache_t)));
	tcache_slow->next_gc_bin = 0;
	tcache_slow->arena = NULL;
	tcache_slow->dyn_alloc = mem;

	/*
	 * We reserve cache bins for all small size classes, even if some may
	 * not get used (i.e. bins higher than tcache_nbins).  This allows
	 * the fast and common paths to access cache bin metadata safely w/o
	 * worrying about which ones are disabled.
	 */
	unsigned tcache_nbins = tcache_nbins_get(tcache_slow);
	size_t cur_offset = 0;
	cache_bin_preincrement(tcache_bin_info, tcache_nbins, mem,
	    &cur_offset);
	for (unsigned i = 0; i < tcache_nbins; i++) {
		if (i < SC_NBINS) {
			tcache_slow->lg_fill_div[i] = 1;
			tcache_slow->bin_refilled[i] = false;
			tcache_slow->bin_flush_delay_items[i]
			    = tcache_gc_item_delay_compute(i);
		}
		cache_bin_t *cache_bin = &tcache->bins[i];
		if (tcache_bin_info[i].ncached_max > 0) {
			cache_bin_init(cache_bin, &tcache_bin_info[i], mem,
			    &cur_offset);
		} else {
			cache_bin_init_disabled(cache_bin,
			    tcache_bin_info[i].ncached_max);
		}
	}
	/*
	 * Initialize all disabled bins to a state that can safely and
	 * efficiently fail all fastpath alloc / free, so that no additional
	 * check around tcache_nbins is needed on fastpath.  Yet we still
	 * store the ncached_max in the bin_info for future usage.
	 */
	for (unsigned i = tcache_nbins; i < TCACHE_NBINS_MAX; i++) {
		cache_bin_t *cache_bin = &tcache->bins[i];
		cache_bin_init_disabled(cache_bin,
		    tcache_bin_info[i].ncached_max);
		assert(tcache_bin_disabled(i, cache_bin, tcache->tcache_slow));
	}

	cache_bin_postincrement(mem, &cur_offset);
	if (config_debug) {
		/* Sanity check that the whole stack is used. */
		size_t size, alignment;
		cache_bin_info_compute_alloc(tcache_bin_info, tcache_nbins,
		    &size, &alignment);
		assert(cur_offset == size);
	}
}